

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::VerifyResourceBinding<Diligent::TopLevelASVkImpl>
               (char *ExpectedResourceTypeName,PipelineResourceDesc *ResDesc,
               BindResourceInfo *BindInfo,TopLevelASVkImpl *pResourceImpl,
               IDeviceObject *pCachedObject,char *SignatureName)

{
  SET_SHADER_RESOURCE_FLAGS SVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  Char *pCVar4;
  TopLevelASDesc *pTVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  Diligent local_428 [32];
  undefined1 local_408 [8];
  string msg_1;
  stringstream local_3c8 [8];
  stringstream ss_1;
  ostream local_3b8 [376];
  Char *local_240;
  char *VarTypeStr;
  undefined1 local_218 [8];
  string msg;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [376];
  char *local_40;
  char *SignatureName_local;
  IDeviceObject *pCachedObject_local;
  TopLevelASVkImpl *pResourceImpl_local;
  BindResourceInfo *BindInfo_local;
  PipelineResourceDesc *ResDesc_local;
  char *ExpectedResourceTypeName_local;
  
  local_40 = SignatureName;
  SignatureName_local = (char *)pCachedObject;
  pCachedObject_local = (IDeviceObject *)pResourceImpl;
  pResourceImpl_local = (TopLevelASVkImpl *)BindInfo;
  BindInfo_local = (BindResourceInfo *)ResDesc;
  ResDesc_local = (PipelineResourceDesc *)ExpectedResourceTypeName;
  if ((BindInfo->pObject == (IDeviceObject *)0x0) || (pResourceImpl != (TopLevelASVkImpl *)0x0)) {
    if ((ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC) ||
       (((SVar1 = operator&(BindInfo->Flags,SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE),
         SVar1 != SET_SHADER_RESOURCE_FLAG_NONE || (SignatureName_local == (char *)0x0)) ||
        ((IDeviceObject *)SignatureName_local == pCachedObject_local)))) {
      ExpectedResourceTypeName_local._7_1_ = 1;
    }
    else {
      local_240 = GetShaderVariableTypeLiteralName
                            (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                              ((long)&BindInfo_local->BufferBaseOffset + 1),false);
      std::__cxx11::stringstream::stringstream(local_3c8);
      poVar2 = std::operator<<(local_3b8,"Non-null ");
      poVar2 = std::operator<<(poVar2,(char *)ResDesc_local);
      poVar2 = std::operator<<(poVar2," \'");
      puVar3 = (undefined8 *)(**(code **)(*(long *)SignatureName_local + 0x20))();
      poVar2 = std::operator<<(poVar2,(char *)*puVar3);
      poVar2 = std::operator<<(poVar2,"\' is already bound to ");
      poVar2 = std::operator<<(poVar2,local_240);
      poVar2 = std::operator<<(poVar2," shader variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                ((String *)((long)&msg_1.field_2 + 8),(PipelineResourceDesc *)BindInfo_local,
                 *(Uint32 *)
                  ((long)&(pResourceImpl_local->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                          .super_ObjectBase<Diligent::ITopLevelASVk>.
                          super_RefCountedObject<Diligent::ITopLevelASVk>.m_pRefCounters + 4));
      poVar2 = std::operator<<(poVar2,(string *)(msg_1.field_2._M_local_buf + 8));
      std::operator<<(poVar2,'\'');
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      if (local_40 != (char *)0x0) {
        poVar2 = std::operator<<(local_3b8," defined by signature \'");
        poVar2 = std::operator<<(poVar2,local_40);
        std::operator<<(poVar2,'\'');
      }
      std::operator<<(local_3b8,". Overwriting the binding with ");
      if (pCachedObject_local == (IDeviceObject *)0x0) {
        std::operator<<(local_3b8,"null");
      }
      else {
        poVar2 = std::operator<<(local_3b8,"another resource (\'");
        pTVar5 = DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                            *)pCachedObject_local);
        poVar2 = std::operator<<(poVar2,(pTVar5->super_DeviceObjectAttribs).Name);
        std::operator<<(poVar2,"\')");
      }
      std::operator<<(local_3b8," is disallowed by default.");
      if (*(char *)((long)&BindInfo_local->BufferBaseOffset + 1) == '\0') {
        poVar2 = std::operator<<(local_3b8,
                                 " If this is intended, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
                                );
        std::operator<<(poVar2,
                        " label the variable as mutable and use another shader resource binding instance, or label the variable as dynamic."
                       );
      }
      else if (*(char *)((long)&BindInfo_local->BufferBaseOffset + 1) == '\x01') {
        poVar2 = std::operator<<(local_3b8,
                                 " If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
                                );
        std::operator<<(poVar2,
                        " use another shader resource binding instance or label the variable as dynamic."
                       );
      }
      std::__cxx11::stringstream::str();
      FormatString<std::__cxx11::string>((string *)local_408,local_428,Args_00);
      std::__cxx11::string::~string((string *)local_428);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyResourceBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0xd9);
      std::__cxx11::string::~string((string *)local_408);
      ExpectedResourceTypeName_local._7_1_ = 0;
      std::__cxx11::stringstream::~stringstream(local_3c8);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar2 = std::operator<<(local_1b8,"Failed to bind object \'");
    puVar3 = (undefined8 *)
             (**(code **)(*(long *)(pResourceImpl_local->
                                   super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                                   super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                                   .super_ObjectBase<Diligent::ITopLevelASVk>.
                                   super_RefCountedObject<Diligent::ITopLevelASVk>.
                                   super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject + 0x20)
             )();
    poVar2 = std::operator<<(poVar2,(char *)*puVar3);
    poVar2 = std::operator<<(poVar2,"\' to variable \'");
    GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
              ((String *)((long)&msg.field_2 + 8),(PipelineResourceDesc *)BindInfo_local,
               *(Uint32 *)
                ((long)&(pResourceImpl_local->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                        .super_ObjectBase<Diligent::ITopLevelASVk>.
                        super_RefCountedObject<Diligent::ITopLevelASVk>.m_pRefCounters + 4));
    poVar2 = std::operator<<(poVar2,(string *)(msg.field_2._M_local_buf + 8));
    std::operator<<(poVar2,'\'');
    std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
    if (local_40 != (char *)0x0) {
      poVar2 = std::operator<<(local_1b8," defined by signature \'");
      poVar2 = std::operator<<(poVar2,local_40);
      std::operator<<(poVar2,'\'');
    }
    poVar2 = std::operator<<(local_1b8,". Invalid resource type: ");
    poVar2 = std::operator<<(poVar2,(char *)ResDesc_local);
    std::operator<<(poVar2," is expected.");
    std::__cxx11::stringstream::str();
    FormatString<std::__cxx11::string>((string *)local_218,(Diligent *)&VarTypeStr,Args);
    std::__cxx11::string::~string((string *)&VarTypeStr);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0xb1);
    std::__cxx11::string::~string((string *)local_218);
    ExpectedResourceTypeName_local._7_1_ = 0;
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  return (bool)(ExpectedResourceTypeName_local._7_1_ & 1);
}

Assistant:

bool VerifyResourceBinding(const char*                 ExpectedResourceTypeName,
                           const PipelineResourceDesc& ResDesc,
                           const BindResourceInfo&     BindInfo,
                           const ResourceImplType*     pResourceImpl, // Expected resource implementation
                           const IDeviceObject*        pCachedObject, // Object already set in the cache
                           const char*                 SignatureName)
{
    if (BindInfo.pObject != nullptr && pResourceImpl == nullptr)
    {
        std::stringstream ss;
        ss << "Failed to bind object '" << BindInfo.pObject->GetDesc().Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
        if (SignatureName != nullptr)
        {
            ss << " defined by signature '" << SignatureName << '\'';
        }
        ss << ". Invalid resource type: " << ExpectedResourceTypeName << " is expected.";
        RESOURCE_VALIDATION_FAILURE(ss.str());

        return false;
    }

    if (ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC &&
        (BindInfo.Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) == 0 &&
        pCachedObject != nullptr && pCachedObject != pResourceImpl)
    {
        const char* VarTypeStr = GetShaderVariableTypeLiteralName(ResDesc.VarType);

        std::stringstream ss;
        ss << "Non-null " << ExpectedResourceTypeName << " '" << pCachedObject->GetDesc().Name << "' is already bound to " << VarTypeStr
           << " shader variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
        if (SignatureName != nullptr)
        {
            ss << " defined by signature '" << SignatureName << '\'';
        }
        ss << ". Overwriting the binding with ";
        if (pResourceImpl != nullptr)
        {
            ss << "another resource ('" << pResourceImpl->GetDesc().Name << "')";
        }
        else
        {
            ss << "null";
        }
        ss << " is disallowed by default.";

        if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC)
        {
            ss << " If this is intended, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
               << " label the variable as mutable and use another shader resource binding instance, or label the variable as dynamic.";
        }
        else if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE)
        {
            ss << " If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
               << " use another shader resource binding instance or label the variable as dynamic.";
        }

        RESOURCE_VALIDATION_FAILURE(ss.str());

        return false;
    }

    return true;
}